

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx2::OrientedDiscMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  byte bVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  int iVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  Scene *pSVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  int local_2cc;
  Scene *local_2c8;
  undefined1 local_2c0 [32];
  float local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  float local_294;
  float local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_280;
  RayQueryContext *local_268;
  Primitive *local_260;
  RayHit *local_258;
  RTCFilterFunctionNArguments local_250;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  float local_1a0 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar66 [64];
  
  local_260 = Disc;
  local_258 = ray;
  local_268 = context;
  pSVar43 = context->scene;
  local_80[0] = Disc->sharedGeomID;
  local_2c8 = pSVar43;
  pGVar8 = (pSVar43->geometries).items[local_80[0]].ptr;
  fVar67 = (pGVar8->time_range).lower;
  fVar17 = pGVar8->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar67) /
           ((pGVar8->time_range).upper - fVar67));
  auVar18 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar18 = vmaxss_avx(ZEXT816(0) << 0x20,auVar18);
  iVar34 = (int)auVar18._0_4_;
  uVar48 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar36 = (long)iVar34 * 0x38;
  lVar10 = *(long *)(lVar9 + lVar36);
  lVar40 = *(long *)(lVar9 + 0x10 + lVar36);
  uVar46 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar41 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar39 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar45 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar45);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar48);
  uVar42 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar42);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar46);
  uVar47 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar47);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar41);
  uVar44 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar44);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar39);
  p_Var11 = pGVar8[2].intersectionFilterN;
  lVar10 = *(long *)(p_Var11 + lVar36);
  lVar40 = *(long *)(p_Var11 + lVar36 + 0x10);
  auVar63._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar45);
  auVar63._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar48);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar42);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar46);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar47);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar41);
  auVar75._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar44);
  auVar75._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar39);
  lVar40 = (long)(iVar34 + 1) * 0x38;
  lVar10 = *(long *)(lVar9 + lVar40);
  lVar9 = *(long *)(lVar9 + 0x10 + lVar40);
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar45);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar48);
  auVar80._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar42);
  auVar80._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar46);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar47);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar41);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar44);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar39);
  lVar9 = *(long *)(p_Var11 + lVar40);
  lVar10 = *(long *)(p_Var11 + lVar40 + 0x10);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar45 * lVar10);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar48 * lVar10);
  fVar17 = fVar17 - auVar18._0_4_;
  auVar62 = vunpcklps_avx(auVar56,auVar58);
  auVar58 = vunpckhps_avx(auVar56,auVar58);
  auVar56 = vunpcklps_avx(auVar76,auVar59);
  local_1e0 = vunpckhps_avx(auVar76,auVar59);
  auVar19 = vunpcklps_avx(auVar62,auVar56);
  local_a0 = vunpckhps_avx(auVar62,auVar56);
  auVar50 = vunpcklps_avx(auVar63,auVar72);
  auVar62 = vunpckhps_avx(auVar63,auVar72);
  auVar20 = vunpcklps_avx(auVar68,auVar75);
  auVar56 = vunpckhps_avx(auVar68,auVar75);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar47 * lVar10);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar41 * lVar10);
  auVar21 = vunpcklps_avx(auVar62,auVar56);
  auVar22 = vunpcklps_avx(auVar50,auVar20);
  auVar62 = vunpckhps_avx(auVar50,auVar20);
  auVar56 = vunpcklps_avx(auVar77,auVar82);
  local_200 = vunpckhps_avx(auVar77,auVar82);
  auVar50 = vunpcklps_avx(auVar80,auVar83);
  local_1c0 = vunpckhps_avx(auVar80,auVar83);
  auVar54 = vunpcklps_avx(auVar56,auVar50);
  auVar50 = vunpckhps_avx(auVar56,auVar50);
  auVar23 = vunpcklps_avx(auVar49,auVar69);
  auVar56 = vunpckhps_avx(auVar49,auVar69);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar42 * lVar10);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar46 * lVar10);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar44);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar39 * lVar10);
  auVar49 = vunpcklps_avx(auVar73,auVar70);
  auVar20 = vunpckhps_avx(auVar73,auVar70);
  auVar20 = vunpcklps_avx(auVar56,auVar20);
  auVar53 = vunpcklps_avx(auVar23,auVar49);
  auVar56 = vunpckhps_avx(auVar23,auVar49);
  fVar67 = 1.0 - fVar17;
  auVar74._4_4_ = fVar67;
  auVar74._0_4_ = fVar67;
  auVar74._8_4_ = fVar67;
  auVar74._12_4_ = fVar67;
  auVar74._16_4_ = fVar67;
  auVar74._20_4_ = fVar67;
  auVar74._24_4_ = fVar67;
  auVar74._28_4_ = fVar67;
  auVar71._0_4_ = fVar17 * auVar54._0_4_;
  auVar71._4_4_ = fVar17 * auVar54._4_4_;
  auVar71._8_4_ = fVar17 * auVar54._8_4_;
  auVar71._12_4_ = fVar17 * auVar54._12_4_;
  auVar71._16_4_ = fVar17 * auVar54._16_4_;
  auVar71._20_4_ = fVar17 * auVar54._20_4_;
  auVar71._24_4_ = fVar17 * auVar54._24_4_;
  auVar71._28_4_ = 0;
  auVar18 = vfmadd231ps_fma(auVar71,auVar74,auVar19);
  auVar23._4_4_ = fVar17 * auVar53._4_4_;
  auVar23._0_4_ = fVar17 * auVar53._0_4_;
  auVar23._8_4_ = fVar17 * auVar53._8_4_;
  auVar23._12_4_ = fVar17 * auVar53._12_4_;
  auVar23._16_4_ = fVar17 * auVar53._16_4_;
  auVar23._20_4_ = fVar17 * auVar53._20_4_;
  auVar23._24_4_ = fVar17 * auVar53._24_4_;
  auVar23._28_4_ = auVar19._28_4_;
  auVar57._0_4_ = fVar17 * auVar56._0_4_;
  auVar57._4_4_ = fVar17 * auVar56._4_4_;
  auVar57._8_4_ = fVar17 * auVar56._8_4_;
  auVar57._12_4_ = fVar17 * auVar56._12_4_;
  auVar57._16_4_ = fVar17 * auVar56._16_4_;
  auVar57._20_4_ = fVar17 * auVar56._20_4_;
  auVar57._24_4_ = fVar17 * auVar56._24_4_;
  auVar57._28_4_ = 0;
  auVar19._4_4_ = fVar17 * auVar20._4_4_;
  auVar19._0_4_ = fVar17 * auVar20._0_4_;
  auVar19._8_4_ = fVar17 * auVar20._8_4_;
  auVar19._12_4_ = fVar17 * auVar20._12_4_;
  auVar19._16_4_ = fVar17 * auVar20._16_4_;
  auVar19._20_4_ = fVar17 * auVar20._20_4_;
  auVar19._24_4_ = fVar17 * auVar20._24_4_;
  auVar19._28_4_ = auVar56._28_4_;
  auVar24 = vfmadd231ps_fma(auVar23,auVar74,auVar22);
  auVar25 = vfmadd231ps_fma(auVar57,auVar74,auVar62);
  auVar26 = vfmadd231ps_fma(auVar19,auVar74,auVar21);
  bVar7 = Disc->numPrimitives;
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  fVar67 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar84._4_4_ = fVar67;
  auVar84._0_4_ = fVar67;
  auVar84._8_4_ = fVar67;
  auVar84._12_4_ = fVar67;
  auVar84._16_4_ = fVar67;
  auVar84._20_4_ = fVar67;
  auVar84._24_4_ = fVar67;
  auVar84._28_4_ = fVar67;
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_e0._4_4_ = fVar1;
  local_e0._0_4_ = fVar1;
  local_e0._8_4_ = fVar1;
  local_e0._12_4_ = fVar1;
  local_e0._16_4_ = fVar1;
  local_e0._20_4_ = fVar1;
  local_e0._24_4_ = fVar1;
  local_e0._28_4_ = fVar1;
  local_c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_bc = local_c0;
  fStack_b8 = local_c0;
  fStack_b4 = local_c0;
  fStack_b0 = local_c0;
  fStack_ac = local_c0;
  fStack_a8 = local_c0;
  fStack_a4 = local_c0;
  auVar62._4_4_ = local_c0 * auVar26._4_4_;
  auVar62._0_4_ = local_c0 * auVar26._0_4_;
  auVar62._8_4_ = local_c0 * auVar26._8_4_;
  auVar62._12_4_ = local_c0 * auVar26._12_4_;
  auVar62._16_4_ = local_c0 * 0.0;
  auVar62._20_4_ = local_c0 * 0.0;
  auVar62._24_4_ = local_c0 * 0.0;
  auVar62._28_4_ = local_c0;
  auVar27 = vfmadd231ps_fma(auVar62,local_e0,ZEXT1632(auVar25));
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar84,ZEXT1632(auVar24));
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = 0x3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  auVar53._16_4_ = 0x3f800000;
  auVar53._20_4_ = 0x3f800000;
  auVar53._24_4_ = 0x3f800000;
  auVar53._28_4_ = 0x3f800000;
  auVar56 = vcmpps_avx(ZEXT1632(auVar27),ZEXT832(0) << 0x20,4);
  auVar62 = vblendvps_avx(auVar53,ZEXT1632(auVar27),auVar56);
  auVar20._4_4_ = fVar17 * auVar50._4_4_;
  auVar20._0_4_ = fVar17 * auVar50._0_4_;
  auVar20._8_4_ = fVar17 * auVar50._8_4_;
  auVar20._12_4_ = fVar17 * auVar50._12_4_;
  auVar20._16_4_ = fVar17 * auVar50._16_4_;
  auVar20._20_4_ = fVar17 * auVar50._20_4_;
  auVar20._24_4_ = fVar17 * auVar50._24_4_;
  auVar20._28_4_ = auVar50._28_4_;
  auVar27 = vfmadd231ps_fma(auVar20,auVar74,local_a0);
  auVar50 = vunpcklps_avx(local_200,local_1c0);
  auVar21._4_4_ = fVar17 * auVar50._4_4_;
  auVar21._0_4_ = fVar17 * auVar50._0_4_;
  auVar21._8_4_ = fVar17 * auVar50._8_4_;
  auVar21._12_4_ = fVar17 * auVar50._12_4_;
  auVar21._16_4_ = fVar17 * auVar50._16_4_;
  auVar21._20_4_ = fVar17 * auVar50._20_4_;
  auVar21._24_4_ = fVar17 * auVar50._24_4_;
  auVar21._28_4_ = local_1c0._28_4_;
  auVar50 = vunpcklps_avx(auVar58,local_1e0);
  auVar28 = vfmadd231ps_fma(auVar21,auVar74,auVar50);
  fVar2 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar50._4_4_ = fVar2;
  auVar50._0_4_ = fVar2;
  auVar50._8_4_ = fVar2;
  auVar50._12_4_ = fVar2;
  auVar50._16_4_ = fVar2;
  auVar50._20_4_ = fVar2;
  auVar50._24_4_ = fVar2;
  auVar50._28_4_ = fVar2;
  auVar50 = vsubps_avx(ZEXT1632(auVar28),auVar50);
  auVar22._4_4_ = auVar26._4_4_ * auVar50._4_4_;
  auVar22._0_4_ = auVar26._0_4_ * auVar50._0_4_;
  auVar22._8_4_ = auVar26._8_4_ * auVar50._8_4_;
  auVar22._12_4_ = auVar26._12_4_ * auVar50._12_4_;
  auVar22._16_4_ = auVar50._16_4_ * 0.0;
  auVar22._20_4_ = auVar50._20_4_ * 0.0;
  auVar22._24_4_ = auVar50._24_4_ * 0.0;
  auVar22._28_4_ = auVar54._28_4_;
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar54._4_4_ = fVar3;
  auVar54._0_4_ = fVar3;
  auVar54._8_4_ = fVar3;
  auVar54._12_4_ = fVar3;
  auVar54._16_4_ = fVar3;
  auVar54._20_4_ = fVar3;
  auVar54._24_4_ = fVar3;
  auVar54._28_4_ = fVar3;
  auVar50 = vsubps_avx(ZEXT1632(auVar27),auVar54);
  auVar29 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar25),auVar50);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar60._4_4_ = fVar4;
  auVar60._0_4_ = fVar4;
  auVar60._8_4_ = fVar4;
  auVar60._12_4_ = fVar4;
  auVar60._16_4_ = fVar4;
  auVar60._20_4_ = fVar4;
  auVar60._24_4_ = fVar4;
  auVar60._28_4_ = fVar4;
  auVar50 = vsubps_avx(ZEXT1632(auVar18),auVar60);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),ZEXT1632(auVar24),auVar50);
  local_2c0 = vdivps_avx(ZEXT1632(auVar29),auVar62);
  uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar64._4_4_ = uVar5;
  auVar64._0_4_ = uVar5;
  auVar64._8_4_ = uVar5;
  auVar64._12_4_ = uVar5;
  auVar64._16_4_ = uVar5;
  auVar64._20_4_ = uVar5;
  auVar64._24_4_ = uVar5;
  auVar64._28_4_ = uVar5;
  auVar62 = vcmpps_avx(auVar64,local_2c0,2);
  fVar6 = (ray->super_RayK<1>).tfar;
  auVar78._4_4_ = fVar6;
  auVar78._0_4_ = fVar6;
  auVar78._8_4_ = fVar6;
  auVar78._12_4_ = fVar6;
  auVar78._16_4_ = fVar6;
  auVar78._20_4_ = fVar6;
  auVar78._24_4_ = fVar6;
  auVar78._28_4_ = fVar6;
  auVar50 = vcmpps_avx(local_2c0,auVar78,2);
  auVar62 = vandps_avx(auVar50,auVar62);
  auVar79._1_3_ = 0;
  auVar79[0] = bVar7;
  auVar79[4] = bVar7;
  auVar79._5_3_ = 0;
  auVar79[8] = bVar7;
  auVar79._9_3_ = 0;
  auVar79[0xc] = bVar7;
  auVar79._13_3_ = 0;
  auVar79[0x10] = bVar7;
  auVar79._17_3_ = 0;
  auVar79[0x14] = bVar7;
  auVar79._21_3_ = 0;
  auVar79[0x18] = bVar7;
  auVar79._25_3_ = 0;
  auVar79[0x1c] = bVar7;
  auVar79._29_3_ = 0;
  auVar50 = vpcmpgtd_avx2(auVar79,_DAT_01fe9900);
  auVar62 = vandps_avx(auVar50,auVar62);
  auVar50 = auVar56 & auVar62;
  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar50 >> 0x7f,0) != '\0') ||
        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar50 >> 0xbf,0) != '\0') ||
      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar50[0x1f] < '\0') {
    auVar50 = vunpckhps_avx(auVar58,local_1e0);
    auVar58 = vunpckhps_avx(local_200,local_1c0);
    auVar31._4_4_ = fVar17 * auVar58._4_4_;
    auVar31._0_4_ = fVar17 * auVar58._0_4_;
    auVar31._8_4_ = fVar17 * auVar58._8_4_;
    auVar31._12_4_ = fVar17 * auVar58._12_4_;
    auVar31._16_4_ = fVar17 * auVar58._16_4_;
    auVar31._20_4_ = fVar17 * auVar58._20_4_;
    auVar31._24_4_ = fVar17 * auVar58._24_4_;
    auVar31._28_4_ = fVar17;
    auVar81 = ZEXT3264(local_2c0);
    auVar30 = vfmadd231ps_fma(auVar31,auVar74,auVar50);
    auVar62 = vandps_avx(auVar56,auVar62);
    auVar29 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
    fVar6 = local_2c0._0_4_;
    fVar17 = local_2c0._4_4_;
    fVar12 = local_2c0._8_4_;
    fVar13 = local_2c0._12_4_;
    fVar14 = local_2c0._16_4_;
    fVar15 = local_2c0._20_4_;
    fVar16 = local_2c0._24_4_;
    auVar61._0_4_ = fVar67 * fVar6 + fVar4;
    auVar61._4_4_ = fVar67 * fVar17 + fVar4;
    auVar61._8_4_ = fVar67 * fVar12 + fVar4;
    auVar61._12_4_ = fVar67 * fVar13 + fVar4;
    auVar61._16_4_ = fVar67 * fVar14 + fVar4;
    auVar61._20_4_ = fVar67 * fVar15 + fVar4;
    auVar61._24_4_ = fVar67 * fVar16 + fVar4;
    auVar61._28_4_ = fVar4 + 0.0;
    auVar55._0_4_ = fVar6 * fVar1 + fVar3;
    auVar55._4_4_ = fVar17 * fVar1 + fVar3;
    auVar55._8_4_ = fVar12 * fVar1 + fVar3;
    auVar55._12_4_ = fVar13 * fVar1 + fVar3;
    auVar55._16_4_ = fVar14 * fVar1 + fVar3;
    auVar55._20_4_ = fVar15 * fVar1 + fVar3;
    auVar55._24_4_ = fVar16 * fVar1 + fVar3;
    auVar55._28_4_ = fVar3 + 0.0;
    auVar51._0_4_ = fVar6 * local_c0 + fVar2;
    auVar51._4_4_ = fVar17 * local_c0 + fVar2;
    auVar51._8_4_ = fVar12 * local_c0 + fVar2;
    auVar51._12_4_ = fVar13 * local_c0 + fVar2;
    auVar51._16_4_ = fVar14 * local_c0 + fVar2;
    auVar51._20_4_ = fVar15 * local_c0 + fVar2;
    auVar51._24_4_ = fVar16 * local_c0 + fVar2;
    auVar51._28_4_ = fVar2 + 0.0;
    auVar62 = vsubps_avx(auVar61,ZEXT1632(auVar18));
    auVar56 = vsubps_avx(auVar55,ZEXT1632(auVar27));
    auVar50 = vsubps_avx(auVar51,ZEXT1632(auVar28));
    auVar32._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar32._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar32._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar32._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    auVar32._16_4_ = auVar50._16_4_ * auVar50._16_4_;
    auVar32._20_4_ = auVar50._20_4_ * auVar50._20_4_;
    auVar32._24_4_ = auVar50._24_4_ * auVar50._24_4_;
    auVar32._28_4_ = auVar50._28_4_;
    auVar18 = vfmadd231ps_fma(auVar32,auVar56,auVar56);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar62,auVar62);
    auVar33._28_4_ = auVar56._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(auVar30._12_4_ * auVar30._12_4_,
                            CONCAT48(auVar30._8_4_ * auVar30._8_4_,
                                     CONCAT44(auVar30._4_4_ * auVar30._4_4_,
                                              auVar30._0_4_ * auVar30._0_4_))));
    auVar62 = vcmpps_avx(ZEXT1632(auVar18),auVar33,1);
    auVar18 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
    auVar18 = vpand_avx(auVar18,auVar29);
    auVar62 = vpmovzxwd_avx2(auVar18);
    auVar62 = vpslld_avx2(auVar62,0x1f);
    if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar62 >> 0x7f,0) != '\0') ||
          (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar62 >> 0xbf,0) != '\0') ||
        (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar62[0x1f] < '\0')
    {
      uVar35 = (ray->super_RayK<1>).mask;
      fVar67 = (ray->super_RayK<1>).tfar;
      local_220 = vpsrad_avx2(auVar62,0x1f);
      local_1a0[8] = 0.0;
      local_1a0[9] = 0.0;
      local_1a0[10] = 0.0;
      local_1a0[0xb] = 0.0;
      local_1a0[0xc] = 0.0;
      local_1a0[0xd] = 0.0;
      local_1a0[0xe] = 0.0;
      local_1a0[0xf] = 0.0;
      local_1a0[0] = 0.0;
      local_1a0[1] = 0.0;
      local_1a0[2] = 0.0;
      local_1a0[3] = 0.0;
      local_1a0[4] = 0.0;
      local_1a0[5] = 0.0;
      local_1a0[6] = 0.0;
      local_1a0[7] = 0.0;
      local_160 = local_2c0;
      local_140 = ZEXT1632(auVar24);
      local_120 = ZEXT1632(auVar25);
      local_100 = ZEXT1632(auVar26);
      auVar65._8_4_ = 0x7f800000;
      auVar65._0_8_ = 0x7f8000007f800000;
      auVar65._12_4_ = 0x7f800000;
      auVar65._16_4_ = 0x7f800000;
      auVar65._20_4_ = 0x7f800000;
      auVar65._24_4_ = 0x7f800000;
      auVar65._28_4_ = 0x7f800000;
      auVar66 = ZEXT3264(auVar65);
      auVar62 = vblendvps_avx(auVar65,local_2c0,auVar62);
      auVar56 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar56 = vminps_avx(auVar62,auVar56);
      auVar50 = vshufpd_avx(auVar56,auVar56,5);
      auVar56 = vminps_avx(auVar56,auVar50);
      auVar50 = vpermpd_avx2(auVar56,0x4e);
      auVar56 = vminps_avx(auVar56,auVar50);
      auVar62 = vcmpps_avx(auVar62,auVar56,0);
      auVar24 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
      auVar18 = vpand_avx(auVar24,auVar18);
      auVar62 = vpmovzxwd_avx2(auVar18);
      auVar62 = vpslld_avx2(auVar62,0x1f);
      if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar62 >> 0x7f,0) == '\0') &&
            (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar62 >> 0xbf,0) == '\0') &&
          (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar62[0x1f])
      {
        auVar62 = local_220;
      }
      uVar37 = vmovmskps_avx(auVar62);
      uVar38 = 0;
      for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
        uVar38 = uVar38 + 1;
      }
      do {
        uVar39 = (ulong)uVar38;
        local_288 = local_80[uVar39];
        pGVar8 = (pSVar43->geometries).items[local_288].ptr;
        if ((pGVar8->mask & uVar35) == 0) {
          *(undefined4 *)(local_220 + uVar39 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar67 = local_1a0[uVar39];
            fVar1 = local_1a0[uVar39 + 8];
            (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar39 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_140 + uVar39 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)(local_120 + uVar39 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)(local_100 + uVar39 * 4);
            ray->u = fVar67;
            ray->v = fVar1;
            ray->primID = (Disc->primIDs).field_0.i[uVar39];
            ray->geomID = local_288;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_1e0._0_4_ = fVar67;
          local_2a0 = *(float *)(local_140 + uVar39 * 4);
          local_29c = *(undefined4 *)(local_120 + uVar39 * 4);
          local_298 = *(undefined4 *)(local_100 + uVar39 * 4);
          local_294 = local_1a0[uVar39];
          local_290 = local_1a0[uVar39 + 8];
          local_28c = (Disc->primIDs).field_0.i[uVar39];
          local_284 = context->user->instID[0];
          local_280 = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar39 * 4);
          local_2cc = -1;
          local_250.valid = &local_2cc;
          local_250.geometryUserPtr = pGVar8->userPtr;
          local_250.context = context->user;
          local_250.ray = (RTCRayN *)ray;
          local_250.hit = (RTCHitN *)&local_2a0;
          local_250.N = 1;
          if ((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar8->intersectionFilterN)(&local_250), *local_250.valid != 0)) {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) &&
                ((*p_Var11)(&local_250), *local_250.valid == 0)))) goto LAB_01848921;
            (((Vec3f *)((long)local_250.ray + 0x30))->field_0).field_0.x = *(float *)local_250.hit;
            (((Vec3f *)((long)local_250.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_250.hit + 4);
            (((Vec3f *)((long)local_250.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_250.hit + 8);
            *(float *)((long)local_250.ray + 0x3c) = *(float *)(local_250.hit + 0xc);
            *(float *)((long)local_250.ray + 0x40) = *(float *)(local_250.hit + 0x10);
            *(float *)((long)local_250.ray + 0x44) = *(float *)(local_250.hit + 0x14);
            *(float *)((long)local_250.ray + 0x48) = *(float *)(local_250.hit + 0x18);
            *(float *)((long)local_250.ray + 0x4c) = *(float *)(local_250.hit + 0x1c);
            *(float *)((long)local_250.ray + 0x50) = *(float *)(local_250.hit + 0x20);
          }
          else {
LAB_01848921:
            (ray->super_RayK<1>).tfar = (float)local_1e0._0_4_;
          }
          auVar81 = ZEXT3264(local_2c0);
          auVar66 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          *(undefined4 *)(local_220 + uVar39 * 4) = 0;
          fVar67 = (ray->super_RayK<1>).tfar;
          auVar52._4_4_ = fVar67;
          auVar52._0_4_ = fVar67;
          auVar52._8_4_ = fVar67;
          auVar52._12_4_ = fVar67;
          auVar52._16_4_ = fVar67;
          auVar52._20_4_ = fVar67;
          auVar52._24_4_ = fVar67;
          auVar52._28_4_ = fVar67;
          auVar62 = vcmpps_avx(local_2c0,auVar52,2);
          local_220 = vandps_avx(auVar62,local_220);
          uVar35 = (ray->super_RayK<1>).mask;
          fVar67 = (ray->super_RayK<1>).tfar;
          pSVar43 = local_2c8;
        }
        if ((((((((local_220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_220 >> 0x7f,0) == '\0') &&
              (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_220 >> 0xbf,0) == '\0') &&
            (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_220[0x1f]) {
          return;
        }
        auVar62 = vblendvps_avx(auVar66._0_32_,auVar81._0_32_,local_220);
        auVar56 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar56 = vminps_avx(auVar62,auVar56);
        auVar50 = vshufpd_avx(auVar56,auVar56,5);
        auVar56 = vminps_avx(auVar56,auVar50);
        auVar50 = vpermpd_avx2(auVar56,0x4e);
        auVar56 = vminps_avx(auVar56,auVar50);
        auVar56 = vcmpps_avx(auVar62,auVar56,0);
        auVar50 = local_220 & auVar56;
        auVar62 = local_220;
        if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0x7f,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar50 >> 0xbf,0) != '\0') ||
            (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar50[0x1f] < '\0') {
          auVar62 = vandps_avx(auVar56,local_220);
        }
        uVar37 = vmovmskps_avx(auVar62);
        uVar38 = 0;
        for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
          uVar38 = uVar38 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }